

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeArrayInitData
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,HeapType type,Name data)

{
  Name seg;
  ArrayInitData *pAVar1;
  bool bVar2;
  optional<wasm::HeapType> ht;
  Ok local_159;
  size_t local_158;
  size_t local_150;
  Err local_148;
  Err *local_128;
  Err *err_1;
  undefined1 local_118 [8];
  Result<wasm::Ok> _val_1;
  Err local_e8;
  Err *local_b8;
  Err *err;
  undefined1 local_a8;
  undefined3 uStack_a7;
  ChildPopper local_a0;
  undefined1 local_98 [8];
  Result<wasm::Ok> _val;
  ArrayInitData curr;
  IRBuilder *this_local;
  Name data_local;
  HeapType type_local;
  
  data_local.super_IString.str._M_len = data.super_IString.str._M_str;
  pAVar1 = (ArrayInitData *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  data_local.super_IString.str._M_str = (char *)type.id;
  ArrayInitData::ArrayInitData(pAVar1);
  ChildPopper::ChildPopper(&local_a0,this);
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)&err,(HeapType *)&data_local.super_IString.str._M_str);
  ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)err;
  ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_a8;
  ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = uStack_a7;
  ChildPopper::visitArrayInitData((Result<wasm::Ok> *)local_98,&local_a0,pAVar1,ht);
  local_b8 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_98);
  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _36_1_ = local_b8 != (Err *)0x0;
  if ((bool)_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_) {
    wasm::Err::Err(&local_e8,local_b8);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_e8);
    wasm::Err::~Err(&local_e8);
  }
  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _37_3_ = 0;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_98);
  if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
    err_1 = (Err *)data_local.super_IString.str._M_str;
    anon_unknown_282::validateTypeAnnotation
              ((Result<wasm::Ok> *)local_118,(HeapType)data_local.super_IString.str._M_str,
               (Expression *)curr.segment.super_IString.str._M_str);
    local_128 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_118);
    bVar2 = local_128 != (Err *)0x0;
    if (bVar2) {
      wasm::Err::Err(&local_148,local_128);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_148);
      wasm::Err::~Err(&local_148);
    }
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar2;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_118);
    if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
      local_150 = data_local.super_IString.str._M_len;
      seg.super_IString.str._M_str = (char *)data_local.super_IString.str._M_len;
      seg.super_IString.str._M_len = data.super_IString.str._M_len;
      local_158 = data.super_IString.str._M_len;
      pAVar1 = Builder::makeArrayInitData
                         (&this->builder,seg,(Expression *)curr.segment.super_IString.str._M_str,
                          curr.ref,curr.index,curr.offset);
      push(this,(Expression *)pAVar1);
      Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_159);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeArrayInitData(HeapType type, Name data) {
  ArrayInitData curr;
  CHECK_ERR(ChildPopper{*this}.visitArrayInitData(&curr, type));
  CHECK_ERR(validateTypeAnnotation(type, curr.ref));
  push(builder.makeArrayInitData(
    data, curr.ref, curr.index, curr.offset, curr.size));
  return Ok{};
}